

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::findCompositeConstant
          (Builder *this,Op typeClass,Op opcode,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *comps,size_t numMembers)

{
  Id *pIVar1;
  bool bVar2;
  int iVar3;
  Id IVar4;
  mapped_type *pmVar5;
  Instruction *this_00;
  ulong unaff_RBP;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_01;
  long lVar9;
  Op local_64;
  ulong local_60;
  Id local_54;
  Op local_50;
  Op local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_40;
  size_t local_38;
  
  this_01 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)&this->groupedConstants;
  local_64 = typeClass;
  local_50 = opcode;
  local_48 = comps;
  local_38 = numMembers;
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](this_01,&local_64);
  if ((int)((ulong)((long)(pmVar5->
                          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pmVar5->
                         super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 3) < 1) {
    this_00 = (Instruction *)0x0;
    uVar7 = 0;
  }
  else {
    lVar9 = 0;
    local_60 = 0;
    local_54 = typeId;
    local_40 = this_01;
    do {
      local_4c = typeClass;
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](this_01,&local_4c);
      this_00 = (pmVar5->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                )._M_impl.super__Vector_impl_data._M_start[lVar9];
      if ((this_00->typeId == typeId) && (this_00->opCode == local_50)) {
        iVar3 = Instruction::getNumOperands(this_00);
        if (iVar3 == (int)local_38) {
          iVar3 = Instruction::getNumOperands(this_00);
          uVar6 = CONCAT71((int7)(unaff_RBP >> 8),1);
          bVar2 = 0 < iVar3;
          uVar7 = uVar6;
          if ((0 < iVar3) &&
             (IVar4 = Instruction::getIdOperand(this_00,0), uVar7 = local_60,
             IVar4 == *(local_48->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start)) {
            lVar8 = 1;
            do {
              iVar3 = Instruction::getNumOperands(this_00);
              bVar2 = lVar8 < iVar3;
              uVar7 = uVar6;
              if (iVar3 <= lVar8) break;
              IVar4 = Instruction::getIdOperand(this_00,(int)lVar8);
              pIVar1 = (local_48->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + lVar8;
              uVar7 = local_60;
              lVar8 = lVar8 + 1;
            } while (IVar4 == *pIVar1);
          }
          local_60 = uVar7 & 0xffffffff;
          this_01 = local_40;
          typeId = local_54;
          if (!bVar2) break;
        }
      }
      lVar9 = lVar9 + 1;
      local_64 = typeClass;
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](this_01,&local_64);
      uVar7 = local_60;
      unaff_RBP = local_60;
    } while (lVar9 < (int)((ulong)((long)(pmVar5->
                                         super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pmVar5->
                                        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  IVar4 = 0;
  if ((uVar7 & 1) != 0) {
    IVar4 = this_00->resultId;
  }
  return IVar4;
}

Assistant:

Id Builder::findCompositeConstant(Op typeClass, Op opcode, Id typeId, const std::vector<Id>& comps, size_t numMembers)
{
    Instruction* constant = nullptr;
    bool found = false;
    for (int i = 0; i < (int)groupedConstants[typeClass].size(); ++i) {
        constant = groupedConstants[typeClass][i];

        if (constant->getTypeId() != typeId)
            continue;

        if (constant->getOpCode() != opcode) {
            continue;
        }

        if (constant->getNumOperands() != (int)numMembers)
            continue;

        // same contents?
        bool mismatch = false;
        for (int op = 0; op < constant->getNumOperands(); ++op) {
            if (constant->getIdOperand(op) != comps[op]) {
                mismatch = true;
                break;
            }
        }
        if (! mismatch) {
            found = true;
            break;
        }
    }

    return found ? constant->getResultId() : NoResult;
}